

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O0

void jinit_downsampler(j_compress_ptr cinfo)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  long *in_RDI;
  boolean smoothok;
  jpeg_component_info *compptr;
  int ci;
  my_downsample_ptr downsample;
  long local_20;
  int local_14;
  
  bVar1 = true;
  puVar3 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x68);
  in_RDI[0x3c] = (long)puVar3;
  *puVar3 = start_pass_downsample;
  puVar3[1] = sep_downsample;
  *(undefined4 *)(puVar3 + 2) = 0;
  if (*(int *)((long)in_RDI + 0x10c) != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x19;
    (**(code **)*in_RDI)(in_RDI);
  }
  local_14 = 0;
  local_20 = in_RDI[0xb];
  for (; local_14 < *(int *)((long)in_RDI + 0x4c); local_14 = local_14 + 1) {
    if ((*(int *)(local_20 + 8) == (int)in_RDI[0x27]) &&
       (*(int *)(local_20 + 0xc) == *(int *)((long)in_RDI + 0x13c))) {
      if ((int)in_RDI[0x22] == 0) {
        puVar3[(long)local_14 + 3] = fullsize_downsample;
      }
      else {
        puVar3[(long)local_14 + 3] = fullsize_smooth_downsample;
        *(undefined4 *)(puVar3 + 2) = 1;
      }
    }
    else if ((*(int *)(local_20 + 8) << 1 == (int)in_RDI[0x27]) &&
            (*(int *)(local_20 + 0xc) == *(int *)((long)in_RDI + 0x13c))) {
      bVar1 = false;
      iVar2 = jsimd_can_h2v1_downsample();
      if (iVar2 == 0) {
        puVar3[(long)local_14 + 3] = h2v1_downsample;
      }
      else {
        puVar3[(long)local_14 + 3] = jsimd_h2v1_downsample;
      }
    }
    else if ((*(int *)(local_20 + 8) << 1 == (int)in_RDI[0x27]) &&
            (*(int *)(local_20 + 0xc) << 1 == *(int *)((long)in_RDI + 0x13c))) {
      if ((int)in_RDI[0x22] == 0) {
        iVar2 = jsimd_can_h2v2_downsample();
        if (iVar2 == 0) {
          puVar3[(long)local_14 + 3] = h2v2_downsample;
        }
        else {
          puVar3[(long)local_14 + 3] = jsimd_h2v2_downsample;
        }
      }
      else {
        puVar3[(long)local_14 + 3] = h2v2_smooth_downsample;
        *(undefined4 *)(puVar3 + 2) = 1;
      }
    }
    else if (((int)in_RDI[0x27] % *(int *)(local_20 + 8) == 0) &&
            (*(int *)((long)in_RDI + 0x13c) % *(int *)(local_20 + 0xc) == 0)) {
      bVar1 = false;
      puVar3[(long)local_14 + 3] = int_downsample;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x26;
      (**(code **)*in_RDI)(in_RDI);
    }
    local_20 = local_20 + 0x60;
  }
  if (((int)in_RDI[0x22] != 0) && (!bVar1)) {
    *(undefined4 *)(*in_RDI + 0x28) = 99;
    (**(code **)(*in_RDI + 8))(in_RDI,0);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_downsampler(j_compress_ptr cinfo)
{
  my_downsample_ptr downsample;
  int ci;
  jpeg_component_info *compptr;
  boolean smoothok = TRUE;

  downsample = (my_downsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_downsampler));
  cinfo->downsample = (struct jpeg_downsampler *)downsample;
  downsample->pub.start_pass = start_pass_downsample;
  downsample->pub.downsample = sep_downsample;
  downsample->pub.need_context_rows = FALSE;

  if (cinfo->CCIR601_sampling)
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, and set up method pointers */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    if (compptr->h_samp_factor == cinfo->max_h_samp_factor &&
        compptr->v_samp_factor == cinfo->max_v_samp_factor) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
        downsample->methods[ci] = fullsize_smooth_downsample;
        downsample->pub.need_context_rows = TRUE;
      } else
#endif
        downsample->methods[ci] = fullsize_downsample;
    } else if (compptr->h_samp_factor * 2 == cinfo->max_h_samp_factor &&
               compptr->v_samp_factor == cinfo->max_v_samp_factor) {
      smoothok = FALSE;
      if (jsimd_can_h2v1_downsample())
        downsample->methods[ci] = jsimd_h2v1_downsample;
      else
        downsample->methods[ci] = h2v1_downsample;
    } else if (compptr->h_samp_factor * 2 == cinfo->max_h_samp_factor &&
               compptr->v_samp_factor * 2 == cinfo->max_v_samp_factor) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
#if defined(__mips__)
        if (jsimd_can_h2v2_smooth_downsample())
          downsample->methods[ci] = jsimd_h2v2_smooth_downsample;
        else
#endif
          downsample->methods[ci] = h2v2_smooth_downsample;
        downsample->pub.need_context_rows = TRUE;
      } else
#endif
      {
        if (jsimd_can_h2v2_downsample())
          downsample->methods[ci] = jsimd_h2v2_downsample;
        else
          downsample->methods[ci] = h2v2_downsample;
      }
    } else if ((cinfo->max_h_samp_factor % compptr->h_samp_factor) == 0 &&
               (cinfo->max_v_samp_factor % compptr->v_samp_factor) == 0) {
      smoothok = FALSE;
      downsample->methods[ci] = int_downsample;
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
  }

#ifdef INPUT_SMOOTHING_SUPPORTED
  if (cinfo->smoothing_factor && !smoothok)
    TRACEMS(cinfo, 0, JTRC_SMOOTH_NOTIMPL);
#endif
}